

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparison_operations.cpp
# Opt level: O2

bool duckdb::TemplatedBooleanOperation<duckdb::GreaterThan>(Value *left,Value *right)

{
  PhysicalType PVar1;
  pointer pVVar2;
  pointer pVVar3;
  bool bVar4;
  byte bVar5;
  int8_t iVar6;
  int8_t iVar7;
  byte bVar8;
  uint16_t uVar9;
  uint16_t uVar10;
  int16_t iVar11;
  int16_t iVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  int32_t iVar15;
  int32_t iVar16;
  vector<duckdb::Value,_true> *pvVar17;
  vector<duckdb::Value,_true> *this;
  const_reference pvVar18;
  const_reference pvVar19;
  vector<duckdb::Value,_true> *pvVar20;
  int64_t iVar21;
  int64_t iVar22;
  uint64_t uVar23;
  uint64_t uVar24;
  string *__lhs;
  string *__rhs;
  InternalException *this_00;
  ulong uVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  size_type __n;
  ulong uVar29;
  bool bVar30;
  bool bVar31;
  float fVar32;
  double dVar33;
  hugeint_t hVar34;
  hugeint_t hVar35;
  LogicalType comparison_type;
  Value left_copy;
  Value right_copy;
  
  right_copy.type_._4_12_ =
       right_copy.type_.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._0_12_;
  left_copy.type_._4_12_ =
       left_copy.type_.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._0_12_;
  bVar4 = LogicalType::operator!=(&left->type_,&right->type_);
  if (bVar4) {
    Value::Value(&left_copy,left);
    Value::Value(&right_copy,right);
    LogicalType::ForceMaxLogicalType(&comparison_type,&left->type_,&right->type_);
    bVar4 = Value::DefaultTryCastAs(&left_copy,&comparison_type,false);
    if ((bVar4) && (bVar4 = Value::DefaultTryCastAs(&right_copy,&comparison_type,false), bVar4)) {
      bVar5 = TemplatedBooleanOperation<duckdb::GreaterThan>(&left_copy,&right_copy);
    }
    else {
      bVar5 = false;
    }
    LogicalType::~LogicalType(&comparison_type);
    Value::~Value(&right_copy);
    Value::~Value(&left_copy);
    goto LAB_013129bc;
  }
  PVar1 = (left->type_).physical_type_;
  switch(PVar1) {
  case BOOL:
    bVar4 = Value::GetValueUnsafe<bool>(left);
    bVar30 = Value::GetValueUnsafe<bool>(right);
    bVar5 = !bVar30 && bVar4;
    break;
  case UINT8:
    bVar5 = Value::GetValueUnsafe<unsigned_char>(left);
    bVar8 = Value::GetValueUnsafe<unsigned_char>(right);
    bVar4 = bVar5 < bVar8;
    bVar30 = bVar5 == bVar8;
    goto LAB_01312db3;
  case INT8:
    iVar6 = Value::GetValueUnsafe<signed_char>(left);
    iVar7 = Value::GetValueUnsafe<signed_char>(right);
    bVar31 = SBORROW1(iVar6,iVar7);
    bVar30 = (char)(iVar6 - iVar7) < '\0';
    bVar4 = iVar6 == iVar7;
    goto LAB_01312d42;
  case UINT16:
    uVar9 = Value::GetValueUnsafe<unsigned_short>(left);
    uVar10 = Value::GetValueUnsafe<unsigned_short>(right);
    bVar4 = uVar9 < uVar10;
    bVar30 = uVar9 == uVar10;
    goto LAB_01312db3;
  case INT16:
    iVar11 = Value::GetValueUnsafe<short>(left);
    iVar12 = Value::GetValueUnsafe<short>(right);
    bVar31 = SBORROW2(iVar11,iVar12);
    bVar30 = (short)(iVar11 - iVar12) < 0;
    bVar4 = iVar11 == iVar12;
    goto LAB_01312d42;
  case UINT32:
    uVar13 = Value::GetValueUnsafe<unsigned_int>(left);
    uVar14 = Value::GetValueUnsafe<unsigned_int>(right);
    bVar4 = uVar13 < uVar14;
    bVar30 = uVar13 == uVar14;
    goto LAB_01312db3;
  case INT32:
    iVar15 = Value::GetValueUnsafe<int>(left);
    iVar16 = Value::GetValueUnsafe<int>(right);
    bVar31 = SBORROW4(iVar15,iVar16);
    bVar30 = iVar15 - iVar16 < 0;
    bVar4 = iVar15 == iVar16;
    goto LAB_01312d42;
  case UINT64:
    uVar23 = Value::GetValueUnsafe<unsigned_long>(left);
    uVar24 = Value::GetValueUnsafe<unsigned_long>(right);
    bVar4 = uVar23 < uVar24;
    bVar30 = uVar23 == uVar24;
LAB_01312db3:
    bVar5 = !bVar4 && !bVar30;
    break;
  case INT64:
    iVar21 = Value::GetValueUnsafe<long>(left);
    iVar22 = Value::GetValueUnsafe<long>(right);
    bVar31 = SBORROW8(iVar21,iVar22);
    bVar30 = iVar21 - iVar22 < 0;
    bVar4 = iVar21 == iVar22;
LAB_01312d42:
    bVar5 = !bVar4 && bVar31 == bVar30;
    break;
  case UINT64|UINT8:
  case DOUBLE|BOOL:
  case DOUBLE|UINT8:
  case DOUBLE|INT8:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x16:
  case STRUCT|BOOL:
  case STRUCT|UINT8:
  case STRUCT|INT8:
  case STRUCT|UINT16:
switchD_01312980_caseD_a:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&left_copy,"Unimplemented type for value comparison",
               (allocator *)&right_copy);
    InternalException::InternalException(this_00,(string *)&left_copy);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    fVar32 = Value::GetValueUnsafe<float>(left);
    left_copy.type_._0_4_ = fVar32;
    fVar32 = Value::GetValueUnsafe<float>(right);
    right_copy.type_._0_4_ = fVar32;
    bVar5 = GreaterThan::Operation<float>((float *)&left_copy,(float *)&right_copy);
    break;
  case DOUBLE:
    dVar33 = Value::GetValueUnsafe<double>(left);
    left_copy.type_._0_8_ = dVar33;
    dVar33 = Value::GetValueUnsafe<double>(right);
    right_copy.type_._0_8_ = dVar33;
    bVar5 = GreaterThan::Operation<double>((double *)&left_copy,(double *)&right_copy);
    break;
  case INTERVAL:
    left_copy.type_._0_16_ = Value::GetValueUnsafe<duckdb::interval_t>(left);
    right_copy.type_._0_16_ = Value::GetValueUnsafe<duckdb::interval_t>(right);
    bVar5 = interval_t::operator>((interval_t *)&left_copy,(interval_t *)&right_copy);
    break;
  case LIST:
    pvVar20 = ListValue::GetChildren(left);
    pvVar17 = ListValue::GetChildren(right);
    __n = 0;
    do {
      uVar28 = (long)(pvVar20->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                     super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pvVar20->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                     super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                     super__Vector_impl_data._M_start;
      uVar25 = (long)(pvVar17->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                     super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pvVar17->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                     super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                     super__Vector_impl_data._M_start;
      if ((__n == (long)uVar28 >> 6) || (__n == (long)uVar25 >> 6)) {
        bVar4 = uVar28 < uVar25;
        bVar30 = uVar28 == uVar25;
        goto LAB_01312db3;
      }
      pvVar18 = vector<duckdb::Value,_true>::get<true>(pvVar20,__n);
      pvVar19 = vector<duckdb::Value,_true>::get<true>(pvVar17,__n);
      bVar5 = ValueOperations::DistinctGreaterThan(pvVar18,pvVar19);
      if ((bool)bVar5) break;
      pvVar18 = vector<duckdb::Value,_true>::get<true>(pvVar20,__n);
      pvVar19 = vector<duckdb::Value,_true>::get<true>(pvVar17,__n);
      bVar4 = ValueOperations::NotDistinctFrom(pvVar18,pvVar19);
      __n = __n + 1;
    } while (bVar4);
    break;
  case STRUCT:
    pvVar20 = StructValue::GetChildren(left);
    pvVar17 = StructValue::GetChildren(right);
    uVar28 = 0;
    while( true ) {
      pVVar2 = (pvVar20->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
               super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pVVar3 = (pvVar20->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
               super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
               super__Vector_impl_data._M_start;
      pvVar18 = vector<duckdb::Value,_true>::get<true>(pvVar20,uVar28);
      pvVar19 = vector<duckdb::Value,_true>::get<true>(pvVar17,uVar28);
      bVar5 = ValueOperations::DistinctGreaterThan(pvVar18,pvVar19);
      if ((((long)pVVar2 - (long)pVVar3 >> 6) - 1U <= uVar28) || ((bool)bVar5)) break;
      pvVar18 = vector<duckdb::Value,_true>::get<true>(pvVar20,uVar28);
      pvVar19 = vector<duckdb::Value,_true>::get<true>(pvVar17,uVar28);
      bVar4 = ValueOperations::NotDistinctFrom(pvVar18,pvVar19);
      if (!bVar4) break;
      uVar28 = uVar28 + 1;
    }
    break;
  case ARRAY:
    pvVar17 = ArrayValue::GetChildren(left);
    this = ArrayValue::GetChildren(right);
    pvVar20 = this;
    uVar28 = 0;
    do {
      uVar25 = uVar28;
      bVar5 = (byte)pvVar20;
      uVar29 = (long)(pvVar17->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                     super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pvVar17->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                     super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                     super__Vector_impl_data._M_start >> 6;
      if (uVar29 <= uVar25) goto LAB_01312dbd;
      pvVar18 = vector<duckdb::Value,_true>::get<true>(pvVar17,uVar25);
      pvVar19 = vector<duckdb::Value,_true>::get<true>(this,uVar25);
      bVar4 = ValueOperations::DistinctGreaterThan(pvVar18,pvVar19);
      if (bVar4) {
        bVar5 = 1;
        goto LAB_01312dbd;
      }
      pvVar18 = vector<duckdb::Value,_true>::get<true>(pvVar17,uVar25);
      pvVar19 = vector<duckdb::Value,_true>::get<true>(this,uVar25);
      bVar4 = ValueOperations::NotDistinctFrom(pvVar18,pvVar19);
      pvVar20 = (vector<duckdb::Value,_true> *)(ulong)bVar4;
      uVar28 = uVar25 + 1;
    } while (bVar4);
    bVar5 = 0;
LAB_01312dbd:
    bVar5 = uVar29 <= uVar25 | bVar5;
    break;
  default:
    if (PVar1 == VARCHAR) {
      __lhs = StringValue::Get_abi_cxx11_(left);
      __rhs = StringValue::Get_abi_cxx11_(right);
      bVar4 = ::std::operator>(__lhs,__rhs);
      return bVar4;
    }
    if (PVar1 == UINT128) {
      left_copy.type_._0_16_ = Value::GetValueUnsafe<duckdb::uhugeint_t>(left);
      right_copy.type_._0_16_ = Value::GetValueUnsafe<duckdb::uhugeint_t>(right);
      bVar5 = uhugeint_t::operator>((uhugeint_t *)&left_copy,(uhugeint_t *)&right_copy);
    }
    else {
      if (PVar1 != INT128) goto switchD_01312980_caseD_a;
      hVar34 = Value::GetValueUnsafe<duckdb::hugeint_t>(left);
      lVar26 = hVar34.upper;
      hVar35 = Value::GetValueUnsafe<duckdb::hugeint_t>(right);
      lVar27 = hVar35.upper;
      bVar5 = hVar35.lower < hVar34.lower && lVar26 == lVar27 ||
              lVar26 != lVar27 && lVar27 <= lVar26;
    }
  }
LAB_013129bc:
  return (bool)(bVar5 & 1);
}

Assistant:

static bool TemplatedBooleanOperation(const Value &left, const Value &right) {
	const auto &left_type = left.type();
	const auto &right_type = right.type();
	if (left_type != right_type) {
		Value left_copy = left;
		Value right_copy = right;

		auto comparison_type = LogicalType::ForceMaxLogicalType(left_type, right_type);
		if (!left_copy.DefaultTryCastAs(comparison_type) || !right_copy.DefaultTryCastAs(comparison_type)) {
			return false;
		}
		D_ASSERT(left_copy.type() == right_copy.type());
		return TemplatedBooleanOperation<OP>(left_copy, right_copy);
	}
	switch (left_type.InternalType()) {
	case PhysicalType::BOOL:
		return OP::Operation(left.GetValueUnsafe<bool>(), right.GetValueUnsafe<bool>());
	case PhysicalType::INT8:
		return OP::Operation(left.GetValueUnsafe<int8_t>(), right.GetValueUnsafe<int8_t>());
	case PhysicalType::INT16:
		return OP::Operation(left.GetValueUnsafe<int16_t>(), right.GetValueUnsafe<int16_t>());
	case PhysicalType::INT32:
		return OP::Operation(left.GetValueUnsafe<int32_t>(), right.GetValueUnsafe<int32_t>());
	case PhysicalType::INT64:
		return OP::Operation(left.GetValueUnsafe<int64_t>(), right.GetValueUnsafe<int64_t>());
	case PhysicalType::UINT8:
		return OP::Operation(left.GetValueUnsafe<uint8_t>(), right.GetValueUnsafe<uint8_t>());
	case PhysicalType::UINT16:
		return OP::Operation(left.GetValueUnsafe<uint16_t>(), right.GetValueUnsafe<uint16_t>());
	case PhysicalType::UINT32:
		return OP::Operation(left.GetValueUnsafe<uint32_t>(), right.GetValueUnsafe<uint32_t>());
	case PhysicalType::UINT64:
		return OP::Operation(left.GetValueUnsafe<uint64_t>(), right.GetValueUnsafe<uint64_t>());
	case PhysicalType::UINT128:
		return OP::Operation(left.GetValueUnsafe<uhugeint_t>(), right.GetValueUnsafe<uhugeint_t>());
	case PhysicalType::INT128:
		return OP::Operation(left.GetValueUnsafe<hugeint_t>(), right.GetValueUnsafe<hugeint_t>());
	case PhysicalType::FLOAT:
		return OP::Operation(left.GetValueUnsafe<float>(), right.GetValueUnsafe<float>());
	case PhysicalType::DOUBLE:
		return OP::Operation(left.GetValueUnsafe<double>(), right.GetValueUnsafe<double>());
	case PhysicalType::INTERVAL:
		return OP::Operation(left.GetValueUnsafe<interval_t>(), right.GetValueUnsafe<interval_t>());
	case PhysicalType::VARCHAR:
		return OP::Operation(StringValue::Get(left), StringValue::Get(right));
	case PhysicalType::STRUCT: {
		auto &left_children = StructValue::GetChildren(left);
		auto &right_children = StructValue::GetChildren(right);
		// this should be enforced by the type
		D_ASSERT(left_children.size() == right_children.size());
		idx_t i = 0;
		for (; i < left_children.size() - 1; ++i) {
			if (ValuePositionComparator::Definite<OP>(left_children[i], right_children[i])) {
				return true;
			}
			if (!ValuePositionComparator::Possible<OP>(left_children[i], right_children[i])) {
				return false;
			}
		}
		return ValuePositionComparator::Final<OP>(left_children[i], right_children[i]);
	}
	case PhysicalType::LIST: {
		auto &left_children = ListValue::GetChildren(left);
		auto &right_children = ListValue::GetChildren(right);
		for (idx_t pos = 0;; ++pos) {
			if (pos == left_children.size() || pos == right_children.size()) {
				return ValuePositionComparator::TieBreak<OP>(left_children.size(), right_children.size());
			}
			if (ValuePositionComparator::Definite<OP>(left_children[pos], right_children[pos])) {
				return true;
			}
			if (!ValuePositionComparator::Possible<OP>(left_children[pos], right_children[pos])) {
				return false;
			}
		}
		return false;
	}
	case PhysicalType::ARRAY: {
		auto &left_children = ArrayValue::GetChildren(left);
		auto &right_children = ArrayValue::GetChildren(right);

		// Should be enforced by the type
		D_ASSERT(left_children.size() == right_children.size());

		for (idx_t i = 0; i < left_children.size(); i++) {
			if (ValuePositionComparator::Definite<OP>(left_children[i], right_children[i])) {
				return true;
			}
			if (!ValuePositionComparator::Possible<OP>(left_children[i], right_children[i])) {
				return false;
			}
		}
		return true;
	}
	default:
		throw InternalException("Unimplemented type for value comparison");
	}
}